

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int walWriteOneFrame(WalWriter *p,PgHdr *pPage,int nTruncate,sqlite3_int64 iOffset)

{
  u32 *aIn;
  Wal *pWVar1;
  int iVar2;
  uint uVar3;
  long in_R8;
  u8 aFrame [24];
  u8 local_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  undefined8 local_40;
  uint local_38;
  uint local_34;
  
  pWVar1 = p->pWal;
  aIn = (pWVar1->hdr).aFrameCksum;
  local_48 = (u8)((uint)nTruncate >> 0x18);
  local_47 = (undefined1)((uint)nTruncate >> 0x10);
  local_46 = (undefined1)((uint)nTruncate >> 8);
  local_45 = (undefined1)nTruncate;
  local_44 = (undefined1)((ulong)iOffset >> 0x18);
  local_43 = (undefined1)((ulong)iOffset >> 0x10);
  local_42 = (undefined1)((ulong)iOffset >> 8);
  local_41 = (undefined1)iOffset;
  local_40 = *(undefined8 *)(pWVar1->hdr).aSalt;
  uVar3 = (uint)((pWVar1->hdr).bigEndCksum == '\0');
  walChecksumBytes(uVar3,&local_48,8,aIn,aIn);
  walChecksumBytes(uVar3,(u8 *)pPage,pWVar1->szPage,aIn,aIn);
  uVar3 = (pWVar1->hdr).aFrameCksum[0];
  local_38 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = (pWVar1->hdr).aFrameCksum[1];
  local_34 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  iVar2 = walWriteToLog(p,&local_48,0x18,in_R8);
  if (iVar2 == 0) {
    iVar2 = walWriteToLog(p,pPage,p->szPage,in_R8 + 0x18);
  }
  return iVar2;
}

Assistant:

static int walWriteOneFrame(
  WalWriter *p,               /* Where to write the frame */
  PgHdr *pPage,               /* The page of the frame to be written */
  int nTruncate,              /* The commit flag.  Usually 0.  >0 for commit */
  sqlite3_int64 iOffset       /* Byte offset at which to write */
){
  int rc;                         /* Result code from subfunctions */
  void *pData;                    /* Data actually written */
  u8 aFrame[WAL_FRAME_HDRSIZE];   /* Buffer to assemble frame-header in */
#if defined(SQLITE_HAS_CODEC)
  if( (pData = sqlite3PagerCodec(pPage))==0 ) return SQLITE_NOMEM;
#else
  pData = pPage->pData;
#endif
  walEncodeFrame(p->pWal, pPage->pgno, nTruncate, pData, aFrame);
  rc = walWriteToLog(p, aFrame, sizeof(aFrame), iOffset);
  if( rc ) return rc;
  /* Write the page data */
  rc = walWriteToLog(p, pData, p->szPage, iOffset+sizeof(aFrame));
  return rc;
}